

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aarect.h
# Opt level: O0

bool __thiscall xy_rect::hit(xy_rect *this,ray *r,double t0,double t1,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  vec3 local_110;
  undefined1 local_f8 [8];
  vec3 outward_normal;
  vec3 local_c8;
  double local_b0;
  double y;
  vec3 local_90;
  double local_78;
  double x;
  vec3 local_58;
  double local_40;
  double t;
  hit_record *rec_local;
  double t1_local;
  double t0_local;
  ray *r_local;
  xy_rect *this_local;
  
  dVar1 = this->k;
  t = (double)rec;
  rec_local = (hit_record *)t1;
  t1_local = t0;
  t0_local = (double)r;
  r_local = (ray *)this;
  ray::origin(&local_58,r);
  dVar2 = vec3::z(&local_58);
  ray::direction((vec3 *)&x,(ray *)t0_local);
  local_40 = vec3::z((vec3 *)&x);
  local_40 = (dVar1 - dVar2) / local_40;
  if ((local_40 < t1_local) || ((double)rec_local < local_40)) {
    this_local._7_1_ = false;
  }
  else {
    ray::origin(&local_90,(ray *)t0_local);
    dVar2 = vec3::x(&local_90);
    dVar1 = local_40;
    ray::direction((vec3 *)&y,(ray *)t0_local);
    dVar3 = vec3::x((vec3 *)&y);
    local_78 = dVar1 * dVar3 + dVar2;
    ray::origin(&local_c8,(ray *)t0_local);
    dVar2 = vec3::y(&local_c8);
    dVar1 = local_40;
    ray::direction((vec3 *)(outward_normal.e + 2),(ray *)t0_local);
    dVar3 = vec3::y((vec3 *)(outward_normal.e + 2));
    local_b0 = dVar1 * dVar3 + dVar2;
    if ((local_78 < this->x0) ||
       (((this->x1 <= local_78 && local_78 != this->x1 || (local_b0 < this->y0)) ||
        (this->y1 <= local_b0 && local_b0 != this->y1)))) {
      this_local._7_1_ = false;
    }
    else {
      *(double *)((long)t + 0x48) = (local_78 - this->x0) / (this->x1 - this->x0);
      *(double *)((long)t + 0x50) = (local_b0 - this->y0) / (this->y1 - this->y0);
      *(double *)((long)t + 0x40) = local_40;
      vec3::vec3((vec3 *)local_f8,0.0,0.0,1.0);
      hit_record::set_face_normal((hit_record *)t,(ray *)t0_local,(vec3 *)local_f8);
      std::shared_ptr<material>::operator=((shared_ptr<material> *)((long)t + 0x30),&this->mp);
      ray::at(&local_110,(ray *)t0_local,local_40);
      *(double *)t = local_110.e[0];
      *(double *)((long)t + 8) = local_110.e[1];
      *(double *)((long)t + 0x10) = local_110.e[2];
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool xy_rect::hit(const ray& r, double t0, double t1, hit_record& rec) const {
    auto t = (k-r.origin().z()) / r.direction().z();
    if (t < t0 || t > t1)
        return false;
    auto x = r.origin().x() + t*r.direction().x();
    auto y = r.origin().y() + t*r.direction().y();
    if (x < x0 || x > x1 || y < y0 || y > y1)
        return false;
    rec.u = (x-x0)/(x1-x0);
    rec.v = (y-y0)/(y1-y0);
    rec.t = t;
    vec3 outward_normal = vec3(0, 0, 1);
    rec.set_face_normal(r, outward_normal);
    rec.mat_ptr = mp;
    rec.p = r.at(t);
    return true;
}